

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O3

BOOL empty_set(List *set,int literal_bits_mask,int literal_bits)

{
  BOOL BVar1;
  int i;
  uint uVar2;
  
  uVar2 = 0;
  while (((uVar2 & literal_bits_mask) != literal_bits ||
         (BVar1 = is_member_of_set((unsigned_short)uVar2,set), BVar1 == FALSE))) {
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x10000) {
      return TRUE;
    }
  }
  return FALSE;
}

Assistant:

BOOL
empty_set (List *set, int literal_bits_mask, int literal_bits)
{
  int i;

  for (i = 0; i < 65536; i++)
    if ((i & literal_bits_mask) == literal_bits && is_member_of_set (i, set))
      return FALSE;
  return TRUE;
}